

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_wait(CURLM *multi_handle,curl_waitfd *extra_fds,uint extra_nfds,int timeout_ms,
                         int *ret)

{
  uint uVar1;
  int iVar2;
  pollfd *ufds;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar6;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong uVar7;
  CURLMcode CVar8;
  int iVar9;
  ushort uVar10;
  SessionHandle *data;
  SessionHandle *data_00;
  curl_socket_t sockbunch [5];
  long timeout_internal;
  
  uVar5 = (ulong)extra_nfds;
  CVar8 = CURLM_BAD_HANDLE;
  if ((multi_handle != (CURLM *)0x0) && (*multi_handle == 0xbab1e)) {
    multi_timeout((Curl_multi *)multi_handle,&timeout_internal);
    data = (SessionHandle *)((long)multi_handle + 8);
    iVar9 = 0;
    uVar6 = extraout_RDX;
    data_00 = data;
LAB_00471991:
    data_00 = data_00->next;
    if (data_00 != (SessionHandle *)0x0) {
      uVar1 = multi_getsock(data_00,sockbunch,(int)uVar6);
      lVar4 = 0;
      uVar6 = extraout_RDX_00;
      do {
        if (lVar4 == 5) break;
        if ((uVar1 >> ((uint)lVar4 & 0x1f) & 1) == 0) {
          uVar6 = 0xffffffff;
        }
        else {
          iVar9 = iVar9 + 1;
          uVar6 = (ulong)(uint)sockbunch[lVar4];
        }
        if (((uVar1 >> ((byte)lVar4 & 0x1f)) >> 0x10 & 1) != 0) {
          iVar9 = iVar9 + 1;
          uVar6 = (ulong)(uint)sockbunch[lVar4];
        }
        lVar4 = lVar4 + 1;
      } while ((int)uVar6 != -1);
      goto LAB_00471991;
    }
    lVar4 = (long)timeout_ms;
    if (timeout_internal < timeout_ms) {
      lVar4 = timeout_internal;
    }
    iVar2 = (int)lVar4;
    if (timeout_internal < 0) {
      iVar2 = timeout_ms;
    }
    uVar6 = 0;
    if (extra_nfds + iVar9 == 0 && extra_nfds == 0) {
      ufds = (pollfd *)0x0;
    }
    else {
      ufds = (pollfd *)(*Curl_cmalloc)((ulong)(extra_nfds + iVar9) << 3);
      uVar5 = extraout_RDX_01;
      if (ufds == (pollfd *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
    }
    if (iVar9 != 0) {
      uVar6 = 0;
LAB_00471a2e:
      data = data->next;
      if (data != (SessionHandle *)0x0) {
        uVar1 = multi_getsock(data,sockbunch,(int)uVar5);
        lVar4 = 0;
        uVar5 = extraout_RDX_02;
        do {
          if (lVar4 == 5) break;
          if ((uVar1 >> ((uint)lVar4 & 0x1f) & 1) == 0) {
            uVar5 = 0xffffffff;
          }
          else {
            uVar5 = (ulong)(uint)sockbunch[lVar4];
            ufds[uVar6].fd = sockbunch[lVar4];
            ufds[uVar6].events = 1;
            uVar6 = (ulong)((int)uVar6 + 1);
          }
          if (((uVar1 >> ((byte)lVar4 & 0x1f)) >> 0x10 & 1) != 0) {
            uVar5 = (ulong)(uint)sockbunch[lVar4];
            ufds[uVar6].fd = sockbunch[lVar4];
            ufds[uVar6].events = 4;
            uVar6 = (ulong)((int)uVar6 + 1);
          }
          lVar4 = lVar4 + 1;
        } while ((int)uVar5 != -1);
        goto LAB_00471a2e;
      }
    }
    for (uVar5 = 0; uVar7 = uVar6 + uVar5, extra_nfds != uVar5; uVar5 = uVar5 + 1) {
      uVar7 = uVar7 & 0xffffffff;
      ufds[uVar7].fd = extra_fds[uVar5].fd;
      uVar10 = extra_fds[uVar5].events & 1;
      ufds[uVar7].events = uVar10;
      if ((extra_fds[uVar5].events & 6U) != 0) {
        ufds[uVar7].events = uVar10 | extra_fds[uVar5].events & 6U;
      }
    }
    CVar8 = CURLM_OK;
    iVar3 = 0;
    if ((uint)uVar7 != 0) {
      Curl_infof((SessionHandle *)0x0,"Curl_poll(%d ds, %d ms)\n",uVar7 & 0xffffffff);
      iVar2 = Curl_poll(ufds,(uint)uVar7,iVar2);
      iVar3 = 0;
      if (iVar2 != 0) {
        for (uVar5 = 0; iVar3 = iVar2, extra_nfds != uVar5; uVar5 = uVar5 + 1) {
          extra_fds[uVar5].revents = ufds[(uint)(iVar9 + (int)uVar5)].revents & 7;
        }
      }
    }
    (*Curl_cfree)(ufds);
    if (ret != (int *)0x0) {
      *ret = iVar3;
    }
  }
  return CVar8;
}

Assistant:

CURLMcode curl_multi_wait(CURLM *multi_handle,
                          struct curl_waitfd extra_fds[],
                          unsigned int extra_nfds,
                          int timeout_ms,
                          int *ret)
{
  struct Curl_multi *multi=(struct Curl_multi *)multi_handle;
  struct SessionHandle *data;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  unsigned int i;
  unsigned int nfds = 0;
  unsigned int curlfds;
  struct pollfd *ufds = NULL;
  long timeout_internal;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* If the internally desired timeout is actually shorter than requested from
     the outside, then use the shorter time! But only if the internal timer
     is actually larger than -1! */
  (void)multi_timeout(multi, &timeout_internal);
  if((timeout_internal >= 0) && (timeout_internal < (long)timeout_ms))
    timeout_ms = (int)timeout_internal;

  /* Count up how many fds we have from the multi handle */
  data=multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if(bitmap & GETSOCK_READSOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(bitmap & GETSOCK_WRITESOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD) {
        break;
      }
    }

    data = data->next; /* check next handle */
  }

  curlfds = nfds; /* number of internal file descriptors */
  nfds += extra_nfds; /* add the externally provided ones */

  if(nfds || extra_nfds) {
    ufds = malloc(nfds * sizeof(struct pollfd));
    if(!ufds)
      return CURLM_OUT_OF_MEMORY;
  }
  nfds = 0;

  /* only do the second loop if we found descriptors in the first stage run
     above */

  if(curlfds) {
    /* Add the curl handles to our pollfds first */
    data=multi->easyp;
    while(data) {
      bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

      for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
        curl_socket_t s = CURL_SOCKET_BAD;

        if(bitmap & GETSOCK_READSOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLIN;
          ++nfds;
          s = sockbunch[i];
        }
        if(bitmap & GETSOCK_WRITESOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLOUT;
          ++nfds;
          s = sockbunch[i];
        }
        if(s == CURL_SOCKET_BAD) {
          break;
        }
      }

      data = data->next; /* check next handle */
    }
  }

  /* Add external file descriptions from poll-like struct curl_waitfd */
  for(i = 0; i < extra_nfds; i++) {
    ufds[nfds].fd = extra_fds[i].fd;
    ufds[nfds].events = 0;
    if(extra_fds[i].events & CURL_WAIT_POLLIN)
      ufds[nfds].events |= POLLIN;
    if(extra_fds[i].events & CURL_WAIT_POLLPRI)
      ufds[nfds].events |= POLLPRI;
    if(extra_fds[i].events & CURL_WAIT_POLLOUT)
      ufds[nfds].events |= POLLOUT;
    ++nfds;
  }

  if(nfds) {
    /* wait... */
    infof(data, "Curl_poll(%d ds, %d ms)\n", nfds, timeout_ms);
    i = Curl_poll(ufds, nfds, timeout_ms);

    if(i) {
      unsigned int j;
      /* copy revents results from the poll to the curl_multi_wait poll
         struct, the bit values of the actual underlying poll() implementation
         may not be the same as the ones in the public libcurl API! */
      for(j = 0; j < extra_nfds; j++) {
        unsigned short mask = 0;
        unsigned r = ufds[curlfds + j].revents;

        if(r & POLLIN)
          mask |= CURL_WAIT_POLLIN;
        if(r & POLLOUT)
          mask |= CURL_WAIT_POLLOUT;
        if(r & POLLPRI)
          mask |= CURL_WAIT_POLLPRI;

        extra_fds[j].revents = mask;
      }
    }
  }
  else
    i = 0;

  free(ufds);
  if(ret)
    *ret = i;
  return CURLM_OK;
}